

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtAig.c
# Opt level: O3

void Cgt_ManDetectCandidates_rec
               (Aig_Man_t *pAig,Vec_Int_t *vUseful,Aig_Obj_t *pObj,int nLevelMax,Vec_Ptr_t *vCands)

{
  int iVar1;
  uint uVar2;
  void **ppvVar3;
  
  if (pObj->TravId != pAig->nTravIds) {
    pObj->TravId = pAig->nTravIds;
    if (0xfffffffd < (*(uint *)&pObj->field_0x18 & 7) - 7) {
      Cgt_ManDetectCandidates_rec
                (pAig,vUseful,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),nLevelMax,
                 vCands);
      Cgt_ManDetectCandidates_rec
                (pAig,vUseful,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),nLevelMax,
                 vCands);
    }
    if (((ulong)pObj & 1) != 0) {
      __assert_fail("!Aig_IsComplement(pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                    ,0x143,"int Aig_ObjLevel(Aig_Obj_t *)");
    }
    if ((int)(*(uint *)&pObj->field_0x1c & 0xffffff) <= nLevelMax) {
      if (vUseful != (Vec_Int_t *)0x0) {
        iVar1 = pObj->Id;
        if (((long)iVar1 < 0) || (vUseful->nSize <= iVar1)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if (vUseful->pArray[iVar1] == 0) {
          return;
        }
      }
      uVar2 = vCands->nSize;
      if (uVar2 == vCands->nCap) {
        if ((int)uVar2 < 0x10) {
          if (vCands->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc(0x80);
          }
          else {
            ppvVar3 = (void **)realloc(vCands->pArray,0x80);
          }
          vCands->pArray = ppvVar3;
          vCands->nCap = 0x10;
        }
        else {
          if (vCands->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc((ulong)uVar2 << 4);
          }
          else {
            ppvVar3 = (void **)realloc(vCands->pArray,(ulong)uVar2 << 4);
          }
          vCands->pArray = ppvVar3;
          vCands->nCap = uVar2 * 2;
        }
      }
      else {
        ppvVar3 = vCands->pArray;
      }
      iVar1 = vCands->nSize;
      vCands->nSize = iVar1 + 1;
      ppvVar3[iVar1] = pObj;
    }
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Computes transitive fanout cone of the node.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Cgt_ManDetectCandidates_rec( Aig_Man_t * pAig, Vec_Int_t * vUseful, Aig_Obj_t * pObj, int nLevelMax, Vec_Ptr_t * vCands )
{
    if ( Aig_ObjIsTravIdCurrent(pAig, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(pAig, pObj);
    if ( Aig_ObjIsNode(pObj) )
    {
        Cgt_ManDetectCandidates_rec( pAig, vUseful, Aig_ObjFanin0(pObj), nLevelMax, vCands );
        Cgt_ManDetectCandidates_rec( pAig, vUseful, Aig_ObjFanin1(pObj), nLevelMax, vCands );
    }
    if ( Aig_ObjLevel(pObj) <= nLevelMax && (vUseful == NULL || Vec_IntEntry(vUseful, Aig_ObjId(pObj))) )
        Vec_PtrPush( vCands, pObj );
}